

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<double>::add_sample(TypedTimeSamples<double> *this,double t,double *v)

{
  Sample s;
  Sample local_20;
  
  local_20.blocked = false;
  local_20.value = *v;
  local_20.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<double>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>
              *)this,&local_20);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }